

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void soul::SanityCheckPass::runPostResolutionChecks(ModuleBase *module)

{
  ASTVisitor local_70;
  undefined8 *local_68;
  undefined8 local_60;
  ulong local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  checkOverallStructure(module);
  local_68 = &local_50;
  local_20 = 0;
  uStack_18 = 0;
  local_30 = 0;
  uStack_28 = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_70._vptr_ASTVisitor = (_func_int **)&PTR__PostResolutionChecks_002cec48;
  local_60 = 0;
  local_58 = 8;
  ASTVisitor::visitObject(&local_70,module);
  local_70._vptr_ASTVisitor = (_func_int **)&PTR__PostResolutionChecks_002cec48;
  local_60 = 0;
  if ((8 < local_58) && (local_68 != (undefined8 *)0x0)) {
    operator_delete__(local_68);
  }
  return;
}

Assistant:

static void runPostResolutionChecks (AST::ModuleBase& module)
    {
        checkOverallStructure (module);
        PostResolutionChecks().ASTVisitor::visitObject (module);
    }